

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O0

type __thiscall
dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::
set<dlib::image_window>
          (member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void> *this,
          image_window *object,mfp_pointer_type cb)

{
  mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
  *in_RCX;
  void *in_RDX;
  mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
  *in_RDI;
  stack_based_memory_block<41UL> *buf;
  mfp_pointer_type in_stack_ffffffffffffff88;
  stack_based_memory_block<41UL> local_58;
  
  local_58.mem._40_8_ = in_RDX;
  local_58.data = in_RCX;
  mfp_kernel_1_base_class<3UL>::destroy_mp_memory((mfp_kernel_1_base_class<3UL> *)0x4978e4);
  buf = &local_58;
  mfp_kernel_1_base_class<3UL>::
  mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
  ::mp_impl_T((mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
               *)local_58.data,(void *)local_58.mem._40_8_,in_stack_ffffffffffffff88);
  mfp_kernel_1_base_class<3ul>::
  mp_impl_T<dlib::member_function_pointer<dlib::vector<long,2l>const&,bool,unsigned_long,void>::mp_impl<dlib::image_window>>
  ::safe_clone<41ul>(in_RDI,buf);
  mfp_kernel_1_base_class<3UL>::
  mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
  ::~mp_impl_T((mp_impl_T<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>::mp_impl<dlib::image_window>_>
                *)0x49792f);
  return;
}

Assistant:

typename disable_if<is_const_type<T>,void>::type 
        set(T& object, typename mp_impl<T>::mfp_pointer_type cb) 
        { DLIB_MFP_SC;  destroy_mp_memory(); mp_impl_T<mp_impl<T> >(&object,cb).safe_clone(mp_memory); }